

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::ComputeEllipsePoints(double *pvec,double *px,double *py,int noPoints)

{
  size_t __n;
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double **_B;
  double **_res;
  double **m;
  double **m_00;
  double **_res_00;
  double **_res_01;
  double **_B_00;
  double **_B_01;
  void *__s;
  double **m_01;
  double **TB;
  double **InvB;
  double **_res_02;
  double **_B_02;
  double **_res_03;
  long lVar8;
  int iVar9;
  ulong uVar10;
  double *in_R9;
  int _colB;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  _colB = noPoints >> 1;
  iVar9 = _colB + 1;
  _B = AllocateMatrix(3,iVar9);
  _res = AllocateMatrix(3,iVar9);
  m = AllocateMatrix(3,iVar9);
  m_00 = AllocateMatrix(3,iVar9);
  _res_00 = AllocateMatrix(3,iVar9);
  _res_01 = AllocateMatrix(3,iVar9);
  _B_00 = AllocateMatrix(3,iVar9);
  _B_01 = AllocateMatrix(3,iVar9);
  lVar12 = (long)_colB;
  __n = lVar12 * 8 + 8;
  uVar10 = 0xffffffffffffffff;
  if (-4 < (int)(noPoints & 0xfffffffeU)) {
    uVar10 = __n;
  }
  __s = operator_new__(uVar10);
  m_01 = AllocateMatrix(3,iVar9);
  TB = AllocateMatrix(3,3);
  InvB = AllocateMatrix(3,3);
  _res_02 = AllocateMatrix(3,2);
  _B_02 = AllocateMatrix(3,2);
  _res_03 = AllocateMatrix(2,2);
  memset(__s,0,__n);
  dVar15 = pvec[6];
  dVar13 = pvec[4];
  dVar14 = pvec[5];
  dVar1 = pvec[3];
  dVar2 = pvec[2];
  pdVar3 = TB[1];
  pdVar3[1] = pvec[1];
  pdVar3[2] = dVar2 * 0.5;
  pdVar3 = TB[2];
  pdVar3[1] = dVar2 * 0.5;
  pdVar3[2] = dVar1;
  pdVar3 = _B_02[1];
  pdVar3[1] = dVar13;
  pdVar4 = _B_02[2];
  pdVar4[1] = dVar14;
  dVar13 = 0.0;
  for (lVar11 = 1; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    dVar14 = cos(dVar13);
    _B[1][lVar11] = dVar14;
    dVar14 = sin(dVar13);
    _B[2][lVar11] = dVar14;
    dVar13 = dVar13 + 3.14781 / (double)_colB;
  }
  inverse(TB,InvB,2);
  AperB(InvB,_B_02,_res_02,2,2,(int)in_R9,1);
  A_TperB(_B_02,_res_02,_res_03,2,1,(int)in_R9,1);
  pdVar5 = _res_03[1];
  pdVar5[1] = dVar15 * -4.0 + pdVar5[1];
  AperB(InvB,_B,_res,2,2,(int)in_R9,_colB);
  for (lVar11 = 1; lVar8 = 1, lVar11 != 3; lVar11 = lVar11 + 1) {
    for (; lVar8 <= lVar12; lVar8 = lVar8 + 1) {
      m_01[lVar11][lVar8] = _B[lVar11][lVar8] * _res[lVar11][lVar8];
    }
  }
  for (lVar11 = 1; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    dVar15 = pdVar5[1] / (m_01[1][lVar11] + m_01[2][lVar11]);
    dVar13 = -1.0;
    if (dVar15 >= 0.0) {
      if (dVar15 < 0.0) {
        dVar13 = sqrt(dVar15);
      }
      else {
        dVar13 = SQRT(dVar15);
      }
    }
    *(double *)((long)__s + lVar11 * 8) = dVar13;
  }
  for (lVar11 = 1; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    dVar15 = *(double *)((long)__s + lVar11 * 8);
    m[2][lVar11] = dVar15;
    m[1][lVar11] = dVar15;
  }
  for (lVar11 = 1; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    m_00[1][lVar11] = pdVar3[1];
    m_00[2][lVar11] = pdVar4[1];
  }
  for (lVar11 = 1; iVar9 = (int)in_R9, lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    pdVar3 = m[1];
    pdVar4 = _B[1];
    pdVar5 = m_00[1];
    _B_00[1][lVar11] = (pdVar3[lVar11] * pdVar4[lVar11] - pdVar5[lVar11]) * 0.5;
    pdVar6 = m[2];
    pdVar7 = _B[2];
    in_R9 = m_00[2];
    _B_00[2][lVar11] = (pdVar6[lVar11] * pdVar7[lVar11] - in_R9[lVar11]) * 0.5;
    _B_01[1][lVar11] = (-pdVar3[lVar11] * pdVar4[lVar11] - pdVar5[lVar11]) * 0.5;
    _B_01[2][lVar11] = (-pdVar6[lVar11] * pdVar7[lVar11] - in_R9[lVar11]) * 0.5;
  }
  AperB(InvB,_B_00,_res_00,2,2,iVar9,_colB);
  AperB(InvB,_B_01,_res_01,2,2,iVar9,_colB);
  for (lVar11 = 1; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
    dVar15 = *(double *)((long)__s + lVar11 * 8);
    if ((dVar15 != -1.0) || (NAN(dVar15))) {
      px[lVar11 + -1] = _res_00[1][lVar11];
      py[lVar11 + -1] = _res_00[2][lVar11];
      px[lVar12 + lVar11 + -1] = _res_01[1][lVar11];
      dVar15 = _res_01[2][lVar11];
    }
    else {
      px[lVar11 + -1] = -1.0;
      py[lVar11 + -1] = -1.0;
      px[lVar12 + lVar11 + -1] = -1.0;
      dVar15 = -1.0;
    }
    py[lVar12 + lVar11 + -1] = dVar15;
  }
  DeallocateMatrix(_B,3);
  DeallocateMatrix(_res,3);
  DeallocateMatrix(m,3);
  DeallocateMatrix(m_00,3);
  DeallocateMatrix(_res_00,3);
  DeallocateMatrix(_res_01,3);
  DeallocateMatrix(_B_00,3);
  DeallocateMatrix(_B_01,3);
  operator_delete__(__s);
  DeallocateMatrix(m_01,3);
  DeallocateMatrix(TB,3);
  DeallocateMatrix(InvB,3);
  DeallocateMatrix(_res_02,3);
  DeallocateMatrix(_B_02,3);
  DeallocateMatrix(_res_03,2);
  return;
}

Assistant:

void EDCircles::ComputeEllipsePoints(double * pvec, double * px, double * py, int noPoints)
{
	if (noPoints % 2) noPoints--;
	int npts = noPoints / 2;

	double **u = AllocateMatrix(3, npts + 1);
	double **Aiu = AllocateMatrix(3, npts + 1);
	double **L = AllocateMatrix(3, npts + 1);
	double **B = AllocateMatrix(3, npts + 1);
	double **Xpos = AllocateMatrix(3, npts + 1);
	double **Xneg = AllocateMatrix(3, npts + 1);
	double **ss1 = AllocateMatrix(3, npts + 1);
	double **ss2 = AllocateMatrix(3, npts + 1);
	double *lambda = new double[npts + 1];
	double **uAiu = AllocateMatrix(3, npts + 1);
	double **A = AllocateMatrix(3, 3);
	double **Ai = AllocateMatrix(3, 3);
	double **Aib = AllocateMatrix(3, 2);
	double **b = AllocateMatrix(3, 2);
	double **r1 = AllocateMatrix(2, 2);
	double Ao, Ax, Ay, Axx, Ayy, Axy;

	double pi = 3.14781;
	double theta;
	int i;
	int j;
	double kk;

	memset(lambda, 0, sizeof(double)*(npts + 1));

	Ao = pvec[6];
	Ax = pvec[4];
	Ay = pvec[5];
	Axx = pvec[1];
	Ayy = pvec[3];
	Axy = pvec[2];

	A[1][1] = Axx; A[1][2] = Axy / 2;
	A[2][1] = Axy / 2; A[2][2] = Ayy;
	b[1][1] = Ax; b[2][1] = Ay;

	// Generate normals linspace
	for (i = 1, theta = 0.0; i <= npts; i++, theta += (pi / npts))
	{
		u[1][i] = cos(theta);
		u[2][i] = sin(theta);
	}

	inverse(A, Ai, 2);

	AperB(Ai, b, Aib, 2, 2, 2, 1);
	A_TperB(b, Aib, r1, 2, 1, 2, 1);
	r1[1][1] = r1[1][1] - 4 * Ao;

	AperB(Ai, u, Aiu, 2, 2, 2, npts);
	for (i = 1; i <= 2; i++)
		for (j = 1; j <= npts; j++)
			uAiu[i][j] = u[i][j] * Aiu[i][j];

	for (j = 1; j <= npts; j++)
	{
		if ((kk = (r1[1][1] / (uAiu[1][j] + uAiu[2][j]))) >= 0.0)
			lambda[j] = sqrt(kk);
		else
			lambda[j] = -1.0;
	}

	// Builds up B and L
	for (j = 1; j <= npts; j++)
		L[1][j] = L[2][j] = lambda[j];
	for (j = 1; j <= npts; j++)
	{
		B[1][j] = b[1][1];
		B[2][j] = b[2][1];
	}

	for (j = 1; j <= npts; j++)
	{
		ss1[1][j] = 0.5 * (L[1][j] * u[1][j] - B[1][j]);
		ss1[2][j] = 0.5 * (L[2][j] * u[2][j] - B[2][j]);
		ss2[1][j] = 0.5 * (-L[1][j] * u[1][j] - B[1][j]);
		ss2[2][j] = 0.5 * (-L[2][j] * u[2][j] - B[2][j]);
	}

	AperB(Ai, ss1, Xpos, 2, 2, 2, npts);
	AperB(Ai, ss2, Xneg, 2, 2, 2, npts);

	for (j = 1; j <= npts; j++)
	{
		if (lambda[j] == -1.0)
		{
			px[j - 1] = -1;
			py[j - 1] = -1;
			px[j - 1 + npts] = -1;
			py[j - 1 + npts] = -1;
		}
		else
		{
			px[j - 1] = Xpos[1][j];
			py[j - 1] = Xpos[2][j];
			px[j - 1 + npts] = Xneg[1][j];
			py[j - 1 + npts] = Xneg[2][j];
		}
	}

	DeallocateMatrix(u, 3);
	DeallocateMatrix(Aiu, 3);
	DeallocateMatrix(L, 3);
	DeallocateMatrix(B, 3);
	DeallocateMatrix(Xpos, 3);
	DeallocateMatrix(Xneg, 3);
	DeallocateMatrix(ss1, 3);
	DeallocateMatrix(ss2, 3);
	delete[] lambda;
	DeallocateMatrix(uAiu, 3);
	DeallocateMatrix(A, 3);
	DeallocateMatrix(Ai, 3);
	DeallocateMatrix(Aib, 3);
	DeallocateMatrix(b, 3);
	DeallocateMatrix(r1, 2);
}